

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O3

int cuddZddGetCofactors2(DdManager *dd,DdNode *f,int v,DdNode **f1,DdNode **f0)

{
  int iVar1;
  DdNode *pDVar2;
  
  pDVar2 = cuddZddSubset1(dd,f,v);
  *f1 = pDVar2;
  iVar1 = 1;
  if (pDVar2 != (DdNode *)0x0) {
    pDVar2 = cuddZddSubset0(dd,f,v);
    *f0 = pDVar2;
    iVar1 = 0;
    if (pDVar2 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,*f1);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int
cuddZddGetCofactors2(
  DdManager * dd,
  DdNode * f,
  int  v,
  DdNode ** f1,
  DdNode ** f0)
{
    *f1 = cuddZddSubset1(dd, f, v);
    if (*f1 == NULL)
        return(1);
    *f0 = cuddZddSubset0(dd, f, v);
    if (*f0 == NULL) {
        Cudd_RecursiveDerefZdd(dd, *f1);
        return(1);
    }
    return(0);

}